

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# okim6258.c
# Opt level: O1

void okim6258_write(void *chip,UINT8 offset,UINT8 data)

{
  uint uVar1;
  ulong uVar2;
  byte bVar3;
  byte bVar4;
  undefined7 in_register_00000031;
  
  switch(CONCAT71(in_register_00000031,offset) & 0xffffffff) {
  case 0:
    if ((data & 1) != 0) {
      *(byte *)((long)chip + 8) = *(byte *)((long)chip + 8) & 0xf9;
      return;
    }
    bVar4 = *(byte *)((long)chip + 8);
    if ((data & 2) == 0) {
      *(byte *)((long)chip + 8) = bVar4 & 0xfd;
    }
    else {
      if ((bVar4 & 2) == 0) {
        *(byte *)((long)chip + 8) = bVar4 | 2;
        *(undefined4 *)((long)chip + 0x1c) = 0xfffe;
        *(undefined1 *)((long)chip + 0x17) = 0;
        *(UINT8 *)((long)chip + 0x20) = data;
        *(undefined2 *)((long)chip + 0x29) = 1;
      }
      *(undefined2 *)((long)chip + 0x1e) = 0;
      *(undefined1 *)((long)chip + 0x17) = 0;
    }
    if ((data & 4) == 0) {
      bVar4 = *(byte *)((long)chip + 8) & 0xfb;
    }
    else {
      bVar4 = *(byte *)((long)chip + 8) | 4;
    }
    *(byte *)((long)chip + 8) = bVar4;
    break;
  case 1:
    if (1 < *(byte *)((long)chip + 0x2a)) {
      *(undefined1 *)((long)chip + 0x29) = 0;
    }
    *(UINT8 *)((long)chip + 0x28) = data;
    *(UINT8 *)((long)chip + (ulong)(*(byte *)((long)chip + 0x29) & 0xf) + 0x20) = data;
    bVar4 = *(byte *)((long)chip + 0x29) + 1;
    bVar3 = *(byte *)((long)chip + 0x29) & 7 | bVar4 & 0xf0;
    if (bVar4 >> 4 != (bVar4 & 7)) {
      bVar3 = bVar4 & 0xf7;
    }
    *(byte *)((long)chip + 0x29) = bVar3;
    *(undefined1 *)((long)chip + 0x2a) = 0;
    return;
  case 2:
    *(UINT8 *)((long)chip + 0x2b) = data;
    return;
  case 8:
  case 9:
  case 10:
    *(UINT8 *)((long)chip + (ulong)(offset & 3) + 0x2e) = data;
    return;
  case 0xb:
    *(UINT8 *)((long)chip + 0x31) = data;
    okim6258_set_clock(chip,0);
    return;
  case 0xc:
    uVar1 = dividers[(ulong)data & 3];
    *(uint *)((long)chip + 0x10) = uVar1;
    if (*(code **)((long)chip + 0x40) != (code *)0x0) {
      uVar2 = (ulong)((uVar1 >> 1) + *(int *)((long)chip + 0xc));
      (**(code **)((long)chip + 0x40))
                (*(undefined8 *)((long)chip + 0x48),uVar2 / uVar1,uVar2 % (ulong)uVar1);
      return;
    }
  }
  return;
}

Assistant:

static void okim6258_write(void *chip, UINT8 offset, UINT8 data)
{
	switch(offset)
	{
	case 0x00:
		okim6258_ctrl_w(chip, data);
		break;
	case 0x01:
		okim6258_data_w(chip, data);
		break;
	case 0x02:
		okim6258_pan_w(chip, data);
		break;
	case 0x08:
	case 0x09:
	case 0x0A:
		okim6258_set_clock_byte(chip, offset & 0x03, data);
		break;
	case 0x0B:
		okim6258_set_clock_byte(chip, offset & 0x03, data);
		okim6258_set_clock(chip, 0);	// refresh clock
		break;
	case 0x0C:
		okim6258_set_divider(chip, data);
		break;
	}
	
	return;
}